

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O3

void tcptran_accept_cb(void *arg)

{
  nni_aio *aio;
  nni_aio *aio_00;
  nng_err result;
  nng_stream *conn;
  tcptran_pipe *local_30;
  tcptran_pipe *p;
  
  aio = (nni_aio *)((long)arg + 0x50);
  nni_mtx_lock((nni_mtx *)arg);
  result = nni_aio_result(aio);
  if (result == NNG_OK) {
    conn = (nng_stream *)nni_aio_get_output(aio,0);
    if (*(char *)((long)arg + 0x3a) == '\x01') {
      nng_stream_free(conn);
      result = NNG_ECLOSED;
      goto LAB_00124d56;
    }
    result = nni_pipe_alloc_listener(&local_30,*(nni_listener **)((long)arg + 0x420));
    if (result != NNG_OK) {
      nng_stream_free(conn);
      goto LAB_00124d56;
    }
    tcptran_pipe_start(local_30,conn,(tcptran_ep *)arg);
  }
  else {
LAB_00124d56:
    aio_00 = *(nni_aio **)((long)arg + 0x48);
    if (aio_00 != (nni_aio *)0x0) {
      *(undefined8 *)((long)arg + 0x48) = 0;
      nni_aio_finish_error(aio_00,result);
    }
    if ((int)result < 0x15) {
      if (result == NNG_ENOMEM) {
LAB_00124d92:
        nng_sleep_aio(10,(nng_aio *)((long)arg + 0x218));
        goto LAB_00124dcb;
      }
      if (result == NNG_ECLOSED) goto LAB_00124dcb;
    }
    else {
      if (result == NNG_ESTOPPED) goto LAB_00124dcb;
      if (result == NNG_ENOFILES) goto LAB_00124d92;
    }
    if (*(char *)((long)arg + 0x3a) != '\0') goto LAB_00124dcb;
  }
  nng_stream_listener_accept(*(nng_stream_listener **)((long)arg + 0x418),aio);
LAB_00124dcb:
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
tcptran_accept_cb(void *arg)
{
	tcptran_ep   *ep  = arg;
	nni_aio      *aio = &ep->connaio;
	tcptran_pipe *p;
	int           rv;
	nng_stream   *conn;

	nni_mtx_lock(&ep->mtx);

	if ((rv = nni_aio_result(aio)) != 0) {
		goto error;
	}

	conn = nni_aio_get_output(aio, 0);

	if (ep->closed) {
		nng_stream_free(conn);
		rv = NNG_ECLOSED;
		goto error;
	}
	rv = nni_pipe_alloc_listener((void **) &p, ep->nlistener);
	if (rv != 0) {
		nng_stream_free(conn);
		goto error;
	}
	tcptran_pipe_start(p, conn, ep);
	nng_stream_listener_accept(ep->listener, &ep->connaio);
	nni_mtx_unlock(&ep->mtx);
	return;

error:
	// When an error here occurs, let's send a notice up to the consumer.
	// That way it can be reported properly.
	if ((aio = ep->useraio) != NULL) {
		ep->useraio = NULL;
		nni_aio_finish_error(aio, rv);
	}
	switch (rv) {
	case NNG_ECLOSED:
	case NNG_ESTOPPED:
		break;

	case NNG_ENOMEM:
	case NNG_ENOFILES:
		nng_sleep_aio(10, &ep->timeaio);
		break;

	default:
		if (!ep->closed) {
			nng_stream_listener_accept(ep->listener, &ep->connaio);
		}
		break;
	}
	nni_mtx_unlock(&ep->mtx);
}